

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O3

Vec_Ptr_t * Gia_IsoCollectCosClasses(Gia_IsoMan_t *p,int fVerbose)

{
  void *pvVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Gia_Man_t *pGVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  ulong local_40;
  ulong local_38;
  
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 1000;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(8000);
  pVVar3->pArray = ppvVar4;
  pGVar7 = p->pGia;
  pVVar5 = pGVar7->vCos;
  uVar9 = (ulong)(uint)pVVar5->nSize;
  if (pGVar7->nRegs < pVVar5->nSize) {
    local_40 = 0;
    local_38 = 1000;
    lVar13 = 0;
    do {
      if ((int)uVar9 <= lVar13) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = pVVar5->pArray[lVar13];
      if (((long)iVar2 < 0) || (pGVar7->nObjs <= iVar2)) {
LAB_0071d3c7:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar7->pObjs == (Gia_Obj_t *)0x0) break;
      if (0 < p->pUniques[iVar2]) {
        pVVar5 = (Vec_Int_t *)malloc(0x10);
        pVVar5->nCap = 0x10;
        pVVar5->nSize = 0;
        piVar6 = (int *)malloc(0x40);
        pVVar5->pArray = piVar6;
        Vec_IntPush(pVVar5,(int)lVar13);
        iVar2 = (int)local_38;
        if ((int)local_40 == iVar2) {
          if (iVar2 < 0x10) {
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
            }
            pVVar3->pArray = ppvVar4;
            pVVar3->nCap = 0x10;
            local_38 = 0x10;
          }
          else {
            local_38 = (ulong)(uint)(iVar2 * 2);
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(local_38 * 8);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,local_38 * 8);
            }
            pVVar3->pArray = ppvVar4;
            pVVar3->nCap = iVar2 * 2;
          }
        }
        else {
          ppvVar4 = pVVar3->pArray;
        }
        pVVar3->nSize = (int)local_40 + 1U;
        ppvVar4[(int)local_40] = pVVar5;
        pGVar7 = p->pGia;
        local_40 = (ulong)((int)local_40 + 1U);
      }
      lVar13 = lVar13 + 1;
      pVVar5 = pGVar7->vCos;
      uVar9 = (ulong)pVVar5->nSize;
    } while (lVar13 < (long)(uVar9 - (long)pGVar7->nRegs));
  }
  else {
    local_40 = 0;
    local_38 = 1000;
  }
  pVVar5 = p->vClasses;
  if (1 < pVVar5->nSize) {
    lVar13 = 0;
    do {
      lVar10 = (long)pVVar5->pArray[lVar13];
      iVar2 = pVVar5->pArray[lVar13 + 1];
      lVar11 = (long)iVar2;
      lVar8 = 0;
      if (lVar11 < 1) {
LAB_0071d218:
        if ((int)lVar8 != iVar2) {
          pVVar5 = (Vec_Int_t *)malloc(0x10);
          pVVar5->nCap = 0x10;
          pVVar5->nSize = 0;
          piVar6 = (int *)malloc(0x40);
          pVVar5->pArray = piVar6;
          if (0 < iVar2) {
            do {
              uVar9 = p->pStoreW[lVar10];
              if ((long)uVar9 < 0) goto LAB_0071d3c7;
              pGVar7 = p->pGia;
              if (pGVar7->nObjs <= (int)(uVar9 >> 0x20)) goto LAB_0071d3c7;
              uVar12 = (uint)*(undefined8 *)(pGVar7->pObjs + (uVar9 >> 0x20));
              if (((~uVar12 & 0x1fffffff) != 0 && (int)uVar12 < 0) &&
                 (uVar12 = (uint)((ulong)*(undefined8 *)(pGVar7->pObjs + (uVar9 >> 0x20)) >> 0x20) &
                           0x1fffffff, (int)uVar12 < pGVar7->vCos->nSize - pGVar7->nRegs)) {
                Vec_IntPush(pVVar5,uVar12);
              }
              lVar10 = lVar10 + 1;
              lVar11 = lVar11 + -1;
            } while (lVar11 != 0);
          }
          iVar2 = (int)local_38;
          if ((int)local_40 == iVar2) {
            if (iVar2 < 0x10) {
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
              }
              pVVar3->pArray = ppvVar4;
              pVVar3->nCap = 0x10;
              local_38 = 0x10;
            }
            else {
              local_38 = (ulong)(uint)(iVar2 * 2);
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(local_38 * 8);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar3->pArray,local_38 * 8);
              }
              pVVar3->pArray = ppvVar4;
              pVVar3->nCap = iVar2 * 2;
            }
          }
          else {
            ppvVar4 = pVVar3->pArray;
          }
          pVVar3->nSize = (int)local_40 + 1U;
          ppvVar4[(int)local_40] = pVVar5;
          pVVar5 = p->vClasses;
          local_40 = (ulong)((int)local_40 + 1U);
        }
      }
      else {
        pGVar7 = p->pGia;
        lVar8 = 0;
        do {
          uVar9 = p->pStoreW[lVar10 + lVar8];
          if (((long)uVar9 < 0) || (pGVar7->nObjs <= (int)(uVar9 >> 0x20))) goto LAB_0071d3c7;
          uVar12 = (uint)*(undefined8 *)(pGVar7->pObjs + (uVar9 >> 0x20));
          if (((~uVar12 & 0x1fffffff) != 0 && (int)uVar12 < 0) &&
             ((int)((uint)((ulong)*(undefined8 *)(pGVar7->pObjs + (uVar9 >> 0x20)) >> 0x20) &
                   0x1fffffff) < pGVar7->vCos->nSize - pGVar7->nRegs)) goto LAB_0071d218;
          lVar8 = lVar8 + 1;
        } while (lVar11 != lVar8);
      }
      lVar13 = lVar13 + 2;
    } while ((int)((uint)lVar13 | 1) < pVVar5->nSize);
  }
  ppvVar4 = pVVar3->pArray;
  if (0 < (int)local_40) {
    uVar9 = 0;
    do {
      pvVar1 = ppvVar4[uVar9];
      qsort(*(void **)((long)pvVar1 + 8),(long)*(int *)((long)pvVar1 + 4),4,Vec_IntSortCompare1);
      uVar9 = uVar9 + 1;
    } while (local_40 != uVar9);
  }
  qsort(ppvVar4,(long)(int)local_40,8,Vec_VecSortCompare3);
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Gia_IsoCollectCosClasses( Gia_IsoMan_t * p, int fVerbose )
{
    Vec_Ptr_t * vGroups;
    Vec_Int_t * vLevel;
    Gia_Obj_t * pObj;
    int i, k, iBegin, nSize;
    // add singletons
    vGroups = Vec_PtrAlloc( 1000 );
    Gia_ManForEachPo( p->pGia, pObj, i )
        if ( p->pUniques[Gia_ObjId(p->pGia, pObj)] > 0 )
        {
            vLevel = Vec_IntAlloc( 1 );
            Vec_IntPush( vLevel, i );
            Vec_PtrPush( vGroups, vLevel );
        }

    // add groups
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin+k) );
            if ( Gia_ObjIsPo(p->pGia, pObj) )
                break;
        }
        if ( k == nSize )
            continue;
        vLevel = Vec_IntAlloc( 8 );
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin+k) );
            if ( Gia_ObjIsPo(p->pGia, pObj) )
                Vec_IntPush( vLevel, Gia_ObjCioId(pObj) );
        }
        Vec_PtrPush( vGroups, vLevel );
    }
    // canonicize order
    Vec_PtrForEachEntry( Vec_Int_t *, vGroups, vLevel, i )
        Vec_IntSort( vLevel, 0 );
    Vec_VecSortByFirstInt( (Vec_Vec_t *)vGroups, 0 );
//    Vec_VecFree( (Vec_Vec_t *)vGroups );
//    return NULL;
    return vGroups;
}